

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_mini_table_oneof.cc
# Opt level: O3

void __thiscall
MiniTableOneofTest_OneOfIteratorProto2_Test::~MiniTableOneofTest_OneOfIteratorProto2_Test
          (MiniTableOneofTest_OneOfIteratorProto2_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(MiniTableOneofTest, OneOfIteratorProto2) {
  constexpr int oneof_first_field_number = 111;
  constexpr int oneof_test_field_number = 116;

  const upb_MiniTable* google_protobuf_table =
      &protobuf_0test_0messages__proto2__TestAllTypesProto2_msg_init;
  const upb_MiniTableField* field =
      upb_MiniTable_FindFieldByNumber(google_protobuf_table, oneof_test_field_number);
  ASSERT_TRUE(field != nullptr);
  const upb_MiniTableField* ptr = upb_MiniTable_GetOneof(google_protobuf_table, field);
  int field_num = oneof_first_field_number;
  do {
    EXPECT_EQ(upb_MiniTableField_Number(ptr), field_num++);
  } while (upb_MiniTable_NextOneofField(google_protobuf_table, &ptr));
}